

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

size_t __thiscall choc::value::Type::Object::getValueDataSize(Object *this)

{
  MainType MVar1;
  int iVar2;
  MemberNameAndType *pMVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  
  uVar4 = (ulong)(this->members).size;
  if (uVar4 == 0) {
    sVar6 = 0;
  }
  else {
    pMVar3 = (this->members).items;
    lVar7 = 0;
    sVar6 = 0;
    do {
      MVar1 = (&(pMVar3->type).mainType)[lVar7];
      sVar5 = 4;
      if (MVar1 < string) {
        switch(MVar1) {
        case void_:
          sVar5 = 0;
          break;
        case boolean:
          sVar5 = 1;
          break;
        case ~(complexArray|primitiveArray|vector|int64|int32|boolean):
        case ~(complexArray|primitiveArray|vector|int64|int32):
        case int32|boolean:
        case ~(complexArray|primitiveArray|vector|int64|boolean):
        case ~(complexArray|primitiveArray|vector|int64):
switchD_001e4c20_caseD_2:
          throwError("Invalid type");
        case int32:
          break;
        case int64:
switchD_001e4c20_caseD_8:
          sVar5 = 8;
          break;
        default:
          if (MVar1 != float32) {
            if (MVar1 != float64) goto switchD_001e4c20_caseD_2;
            goto switchD_001e4c20_caseD_8;
          }
        }
      }
      else if (MVar1 < primitiveArray) {
        if (MVar1 != string) {
          if (MVar1 != vector) goto switchD_001e4c20_caseD_2;
          sVar5 = (ulong)*(uint *)((long)&(pMVar3->type).content + lVar7 + 4) *
                  (ulong)((byte)(pMVar3->type).content.field4[lVar7] & 0xf);
        }
      }
      else if (MVar1 == primitiveArray) {
        iVar2 = *(int *)((long)&(pMVar3->type).content + lVar7 + 8);
        sVar5 = (ulong)*(uint *)((long)&(pMVar3->type).content + lVar7 + 4) *
                (ulong)((iVar2 + (uint)(iVar2 == 0)) *
                       ((byte)(pMVar3->type).content.field4[lVar7] & 0xf));
      }
      else if (MVar1 == complexArray) {
        sVar5 = ComplexArray::getValueDataSize
                          (*(ComplexArray **)((long)&(pMVar3->type).content + lVar7));
      }
      else {
        if (MVar1 != object) goto switchD_001e4c20_caseD_2;
        sVar5 = getValueDataSize(*(Object **)((long)&(pMVar3->type).content + lVar7));
      }
      sVar6 = sVar6 + sVar5;
      lVar7 = lVar7 + 0x30;
    } while (uVar4 * 0x30 != lVar7);
  }
  return sVar6;
}

Assistant:

ObjectType* end() const                     { return items + size; }